

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlShellDir(void)

{
  int iVar1;
  int iVar2;
  xmlShellCtxtPtr val;
  char *val_00;
  xmlNodePtr val_01;
  xmlNodePtr val_02;
  int local_54;
  int n_node2;
  xmlNodePtr node2;
  int n_node;
  xmlNodePtr node;
  int n_arg;
  char *arg;
  int n_ctxt;
  xmlShellCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (arg._4_4_ = 0; (int)arg._4_4_ < 1; arg._4_4_ = arg._4_4_ + 1) {
    for (node._4_4_ = 0; (int)node._4_4_ < 1; node._4_4_ = node._4_4_ + 1) {
      for (node2._4_4_ = 0; (int)node2._4_4_ < 3; node2._4_4_ = node2._4_4_ + 1) {
        for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_xmlShellCtxtPtr(arg._4_4_,0);
          val_00 = gen_char_ptr(node._4_4_,1);
          val_01 = gen_xmlNodePtr(node2._4_4_,2);
          val_02 = gen_xmlNodePtr(local_54,3);
          iVar2 = xmlShellDir(val,val_00,val_01,val_02);
          desret_int(iVar2);
          call_tests = call_tests + 1;
          des_xmlShellCtxtPtr(arg._4_4_,val,0);
          des_char_ptr(node._4_4_,val_00,1);
          des_xmlNodePtr(node2._4_4_,val_01,2);
          des_xmlNodePtr(local_54,val_02,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlShellDir",(ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)arg._4_4_);
            printf(" %d",(ulong)node._4_4_);
            printf(" %d",(ulong)node2._4_4_);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlShellDir(void) {
    int test_ret = 0;

#if defined(LIBXML_DEBUG_ENABLED) && defined(LIBXML_XPATH_ENABLED)
    int mem_base;
    int ret_val;
    xmlShellCtxtPtr ctxt; /* the shell context */
    int n_ctxt;
    char * arg; /* unused */
    int n_arg;
    xmlNodePtr node; /* a node */
    int n_node;
    xmlNodePtr node2; /* unused */
    int n_node2;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlShellCtxtPtr;n_ctxt++) {
    for (n_arg = 0;n_arg < gen_nb_char_ptr;n_arg++) {
    for (n_node = 0;n_node < gen_nb_xmlNodePtr;n_node++) {
    for (n_node2 = 0;n_node2 < gen_nb_xmlNodePtr;n_node2++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlShellCtxtPtr(n_ctxt, 0);
        arg = gen_char_ptr(n_arg, 1);
        node = gen_xmlNodePtr(n_node, 2);
        node2 = gen_xmlNodePtr(n_node2, 3);

        ret_val = xmlShellDir(ctxt, arg, node, node2);
        desret_int(ret_val);
        call_tests++;
        des_xmlShellCtxtPtr(n_ctxt, ctxt, 0);
        des_char_ptr(n_arg, arg, 1);
        des_xmlNodePtr(n_node, node, 2);
        des_xmlNodePtr(n_node2, node2, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlShellDir",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_arg);
            printf(" %d", n_node);
            printf(" %d", n_node2);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}